

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingSequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingSequenceExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,TimingControlSyntax *args,SequenceExprSyntax *args_1)

{
  ClockingSequenceExprSyntax *this_00;
  
  this_00 = (ClockingSequenceExprSyntax *)allocate(this,0x20,8);
  slang::syntax::ClockingSequenceExprSyntax::ClockingSequenceExprSyntax(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }